

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

DefinesPartition * __thiscall
VulkanHppGenerator::partitionDefines
          (DefinesPartition *__return_storage_ptr__,VulkanHppGenerator *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>_>_>
          *defines)

{
  _Rb_tree_header *p_Var1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>
  *__v;
  bool bVar2;
  _Base_ptr p_Var3;
  long lVar4;
  DefinesPartition *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_dd;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_dc;
  allocator<char> local_db;
  allocator<char> local_da;
  allocator<char> local_d9;
  DefinesPartition *local_d8;
  DefinesPartition *local_d0;
  DefinesPartition *local_c8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoredDefines;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70 [32];
  string local_50 [32];
  
  p_Var1 = &(__return_storage_ptr__->callees)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->callees)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  *(undefined8 *)&(__return_storage_ptr__->callees)._M_t._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->callees)._M_t._M_impl.super__Rb_tree_header._M_header = 0
  ;
  (__return_storage_ptr__->callees)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->callees)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(__return_storage_ptr__->callers)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->callees)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(__return_storage_ptr__->callers)._M_t._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->callers)._M_t._M_impl.super__Rb_tree_header._M_header = 0
  ;
  (__return_storage_ptr__->callers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->callers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->callers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->callers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(__return_storage_ptr__->values)._M_t._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8 = (DefinesPartition *)&__return_storage_ptr__->callers;
  p_Var3 = (defines->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_d0 = (DefinesPartition *)&__return_storage_ptr__->values;
  local_d8 = __return_storage_ptr__;
  do {
    if ((_Rb_tree_header *)p_Var3 == &(defines->_M_t)._M_impl.super__Rb_tree_header) {
      return __return_storage_ptr__;
    }
    __v = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>
           *)(p_Var3 + 1);
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            starts_with((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v,
                        "VK_");
    if ((bVar2) &&
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__v,"VK_DEFINE_HANDLE"), !bVar2)) {
      if (p_Var3[4]._M_right == (_Base_ptr)0x0) {
        if (p_Var3[6]._M_left == (_Base_ptr)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_90,"VK_DEFINE_NON_DISPATCHABLE_HANDLE",&local_d9);
          std::__cxx11::string::string<std::allocator<char>>(local_70,"VK_NULL_HANDLE",&local_da);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_50,"VK_USE_64_BIT_PTR_DEFINES",&local_db);
          __l._M_len = 3;
          __l._M_array = &local_90;
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::set(&ignoredDefines,__l,&local_dc,&local_dd);
          lVar4 = 0x40;
          do {
            std::__cxx11::string::~string((string *)((long)&local_90._M_dataplus._M_p + lVar4));
            lVar4 = lVar4 + -0x20;
          } while (lVar4 != -0x20);
          bVar2 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::contains(&ignoredDefines,(key_type *)__v);
          __return_storage_ptr__ = local_d8;
          if (!bVar2) {
            __assert_fail("ignoredDefines.contains( define.first )",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x3ddd,
                          "VulkanHppGenerator::DefinesPartition VulkanHppGenerator::partitionDefines(const std::map<std::string, DefineData> &)"
                         );
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&ignoredDefines._M_t);
          goto LAB_0010a7aa;
        }
        this_00 = __return_storage_ptr__;
        if (p_Var3[5]._M_left == p_Var3[5]._M_right) {
          this_00 = local_d0;
        }
      }
      else if ((p_Var3[5]._M_left == p_Var3[5]._M_right) ||
              (this_00 = local_c8, p_Var3[6]._M_left != (_Base_ptr)0x0)) {
        __assert_fail("!define.second.params.empty() && define.second.possibleDefinition.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x3ded,
                      "VulkanHppGenerator::DefinesPartition VulkanHppGenerator::partitionDefines(const std::map<std::string, DefineData> &)"
                     );
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::DefineData>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::DefineData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::DefineData>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,VulkanHppGenerator::DefineData>const&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::DefineData>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::DefineData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::DefineData>>>
                  *)this_00,__v);
    }
LAB_0010a7aa:
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

VulkanHppGenerator::DefinesPartition VulkanHppGenerator::partitionDefines( std::map<std::string, DefineData> const & defines )
{
  DefinesPartition partition{};
  for ( auto const & define : defines )
  {
    // VK_DEFINE_HANDLE is macro magic that cannot be constexpr-ed
    // Also filter out the VKSC_ macros, as although they are in the spec, they are not defined in any header.
    if ( define.first.starts_with( "VK_" ) && ( define.first != "VK_DEFINE_HANDLE" ) )
    {
      if ( define.second.possibleCallee.empty() )
      {
        if ( define.second.possibleDefinition.empty() )
        {
#if !defined( NDEBUG )
          const std::set<std::string> ignoredDefines{ "VK_DEFINE_NON_DISPATCHABLE_HANDLE", "VK_NULL_HANDLE", "VK_USE_64_BIT_PTR_DEFINES" };
#endif
          assert( ignoredDefines.contains( define.first ) );
        }
        else
        {
          if ( define.second.params.empty() )
          {
            partition.values.insert( define );
          }
          else
          {
            partition.callees.insert( define );
          }
        }
      }
      else
      {
        assert( !define.second.params.empty() && define.second.possibleDefinition.empty() );
        partition.callers.insert( define );
      }
    }
  }
  return partition;
}